

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O0

void __thiscall calculator::ExpressionTree::parseExpression(ExpressionTree *this,string *text)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
  *this_00;
  undefined4 extraout_var_00;
  stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *this_01;
  SyntaxError *this_02;
  UI_STRING *in_RDX;
  UI_STRING *extraout_RDX;
  UI_STRING *uis;
  UI_STRING *extraout_RDX_00;
  string *ui;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *text_local;
  ExpressionTree *this_local;
  
  local_18 = text;
  text_local = (string *)this;
  iVar2 = Lexer::reader(&this->lexer_,(UI *)text,in_RDX);
  ui = local_18;
  Reader::set_buffer((Reader *)CONCAT44(extraout_var,iVar2),local_18);
  this_00 = Lexer::tokenList(&this->lexer_);
  std::
  vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>::
  clear(this_00);
  uis = extraout_RDX;
  while( true ) {
    iVar2 = Lexer::reader(&this->lexer_,(UI *)ui,uis);
    bVar1 = Reader::eof((Reader *)CONCAT44(extraout_var_00,iVar2));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    Lexer::scan(&this->lexer_);
    uis = extraout_RDX_00;
  }
  this_01 = Lexer::bm(&this->lexer_);
  bVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::empty(this_01);
  if (!bVar1) {
    this_02 = (SyntaxError *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"expression unexpected )!",&local_39);
    SyntaxError::SyntaxError(this_02,&local_38);
    __cxa_throw(this_02,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  return;
}

Assistant:

void ExpressionTree::parseExpression(const std::string &text) {
    // 重新设置文本串
    lexer_.reader().set_buffer(text);
    // 清除token
    lexer_.tokenList().clear();
    // 词法分析阶段开始
    while (!lexer_.reader().eof()) lexer_.scan();

    // 然后判断表达式是否括号匹配
    if (!lexer_.bm().empty()) throw SyntaxError("expression unexpected )!");
}